

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::GeneratorHelpers::generateSkeleton
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  uchar *in_RCX;
  __off_t __length;
  size_t in_R8;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    bVar2 = notation(macros,sb,status);
    if (bVar2) {
      UnicodeString::append(sb,L' ');
    }
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      bVar2 = unit(macros,sb,status);
      if (bVar2) {
        UnicodeString::append(sb,L' ');
      }
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        bVar2 = perUnit(macros,sb,status);
        if (bVar2) {
          UnicodeString::append(sb,L' ');
        }
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 == '\0') {
          bVar2 = precision(macros,sb,status);
          if (bVar2) {
            UnicodeString::append(sb,L' ');
          }
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 == '\0') {
            bVar2 = roundingMode(macros,sb,status);
            if (bVar2) {
              UnicodeString::append(sb,L' ');
            }
            UVar1 = ::U_FAILURE(*status);
            if (UVar1 == '\0') {
              bVar2 = grouping(macros,sb,status);
              if (bVar2) {
                UnicodeString::append(sb,L' ');
              }
              UVar1 = ::U_FAILURE(*status);
              if (UVar1 == '\0') {
                bVar2 = integerWidth(macros,sb,status);
                if (bVar2) {
                  UnicodeString::append(sb,L' ');
                }
                UVar1 = ::U_FAILURE(*status);
                if (UVar1 == '\0') {
                  bVar2 = symbols(macros,sb,status);
                  if (bVar2) {
                    UnicodeString::append(sb,L' ');
                  }
                  UVar1 = ::U_FAILURE(*status);
                  if (UVar1 == '\0') {
                    bVar2 = unitWidth(macros,sb,status);
                    if (bVar2) {
                      UnicodeString::append(sb,L' ');
                    }
                    UVar1 = ::U_FAILURE(*status);
                    if (UVar1 == '\0') {
                      uVar3 = sign((EVP_PKEY_CTX *)macros,(uchar *)sb,(size_t *)status,in_RCX,in_R8)
                      ;
                      if ((uVar3 & 1) != 0) {
                        UnicodeString::append(sb,L' ');
                      }
                      UVar1 = ::U_FAILURE(*status);
                      if (UVar1 == '\0') {
                        bVar2 = decimal(macros,sb,status);
                        if (bVar2) {
                          UnicodeString::append(sb,L' ');
                        }
                        UVar1 = ::U_FAILURE(*status);
                        if (UVar1 == '\0') {
                          bVar2 = scale(macros,sb,status);
                          if (bVar2) {
                            UnicodeString::append(sb,L' ');
                          }
                          UVar1 = ::U_FAILURE(*status);
                          if (UVar1 == '\0') {
                            bVar2 = Padder::isBogus(&macros->padder);
                            if (bVar2) {
                              if (macros->affixProvider == (AffixPatternProvider *)0x0) {
                                if (macros->rules == (PluralRules *)0x0) {
                                  if (macros->currencySymbols == (CurrencySymbols *)0x0) {
                                    iVar4 = UnicodeString::length(sb);
                                    if (0 < iVar4) {
                                      iVar4 = UnicodeString::length(sb);
                                      UnicodeString::truncate
                                                (sb,(char *)(ulong)(iVar4 - 1),__length);
                                    }
                                  }
                                  else {
                                    *status = U_UNSUPPORTED_ERROR;
                                  }
                                }
                                else {
                                  *status = U_UNSUPPORTED_ERROR;
                                }
                              }
                              else {
                                *status = U_UNSUPPORTED_ERROR;
                              }
                            }
                            else {
                              *status = U_UNSUPPORTED_ERROR;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GeneratorHelpers::generateSkeleton(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (U_FAILURE(status)) { return; }

    // Supported options
    if (GeneratorHelpers::notation(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::unit(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::perUnit(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::precision(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::roundingMode(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::grouping(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::integerWidth(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::symbols(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::unitWidth(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::sign(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::decimal(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }
    if (GeneratorHelpers::scale(macros, sb, status)) {
        sb.append(u' ');
    }
    if (U_FAILURE(status)) { return; }

    // Unsupported options
    if (!macros.padder.isBogus()) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }
    if (macros.affixProvider != nullptr) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }
    if (macros.rules != nullptr) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }
    if (macros.currencySymbols != nullptr) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    // Remove the trailing space
    if (sb.length() > 0) {
        sb.truncate(sb.length() - 1);
    }
}